

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_optimizer.c
# Opt level: O0

_Bool optimize_const_instruction(inst_t *inst,inst_t *inst1,inst_t *inst2)

{
  long local_80;
  long local_78;
  double local_70;
  double local_68;
  long local_60;
  int64_t n2;
  int64_t n1;
  int64_t n;
  double d2;
  double d1;
  double d;
  optag_t type;
  inst_t *inst2_local;
  inst_t *inst1_local;
  inst_t *inst_local;
  
  if (inst2 == (inst_t *)0x0) {
    inst_local._7_1_ = false;
  }
  else {
    d1 = 0.0;
    d2 = 0.0;
    n = 0;
    n1 = 0;
    n2 = 0;
    local_60 = 0;
    if (inst1->tag == inst2->tag) {
      d._4_4_ = inst1->tag;
    }
    else {
      d._4_4_ = DOUBLE_TAG;
    }
    if ((inst->p2 == inst1->p1) && (inst->p3 == inst2->p2)) {
      if (d._4_4_ == DOUBLE_TAG) {
        if (inst1->tag == INT_TAG) {
          local_68 = (double)(inst1->field_5).n;
        }
        else {
          local_68 = (inst1->field_5).d;
        }
        d2 = local_68;
        if (inst2->tag == INT_TAG) {
          local_70 = (double)(inst2->field_5).n;
        }
        else {
          local_70 = (double)(inst2->field_5).n;
        }
        n = (int64_t)local_70;
      }
      else {
        if (inst1->tag == INT_TAG) {
          local_78 = (inst1->field_5).n;
        }
        else {
          local_78 = (long)(inst1->field_5).d;
        }
        n2 = local_78;
        if (inst2->tag == INT_TAG) {
          local_80 = (inst2->field_5).n;
        }
        else {
          local_80 = (long)(inst2->field_5).d;
        }
        local_60 = local_80;
      }
      switch(inst->op) {
      case ADD:
        if (d._4_4_ == DOUBLE_TAG) {
          d1 = d2 + (double)n;
        }
        else {
          n1 = n2 + local_60;
        }
        break;
      case SUB:
        if (d._4_4_ == DOUBLE_TAG) {
          d1 = d2 - (double)n;
        }
        else {
          n1 = n2 - local_60;
        }
        break;
      case DIV:
        if ((long)(double)n == 0) {
          return false;
        }
        if (d._4_4_ == DOUBLE_TAG) {
          d1 = d2 / (double)n;
        }
        else {
          n1 = n2 / local_60;
        }
        break;
      case MUL:
        if (d._4_4_ == DOUBLE_TAG) {
          d1 = d2 * (double)n;
        }
        else {
          n1 = n2 * local_60;
        }
        break;
      case REM:
        if ((long)(double)n == 0) {
          return false;
        }
        if (d._4_4_ == DOUBLE_TAG) {
          d1 = (double)((long)d2 % (long)(double)n);
        }
        else {
          n1 = n2 % local_60;
        }
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_optimizer.c"
                      ,0x154,"_Bool optimize_const_instruction(inst_t *, inst_t *, inst_t *)");
      }
      inst_setskip(inst1);
      inst_setskip(inst2);
      inst->op = LOADI;
      inst->tag = d._4_4_;
      inst->p3 = 0;
      inst->p2 = 0;
      if (d._4_4_ == DOUBLE_TAG) {
        (inst->field_5).d = d1;
      }
      else {
        (inst->field_5).n = n1;
      }
      inst_local._7_1_ = true;
    }
    else {
      inst_local._7_1_ = false;
    }
  }
  return inst_local._7_1_;
}

Assistant:

static bool optimize_const_instruction (inst_t *inst, inst_t *inst1, inst_t *inst2) {
    if (!inst2) return false;
    
    // select type algorithm:
    // two numeric types are supported here, int64 or double
    // if types are equals then set the first one
    // if types are not equals then set to double
    optag_t type;
    double  d = 0.0, d1 = 0.0, d2 = 0.0;
    int64_t n = 0, n1 = 0, n2 = 0;

    // compute types
    if (inst1->tag == inst2->tag) type = inst1->tag;
    else type = DOUBLE_TAG;

    // check registers
    // code like:
    //      var i = 13;
    //      return 20 + i*100;
    // produces the following bytecode
    //      00000    LOADI 2 13
    //      00001    MOVE 1 2
    //      00002    LOADI 2 20
    //      00003    LOADI 3 100
    //      00004    MUL 3 1 3
    //      00005    ADD 2 2 3
    // inst points to a MATH instruction but registers are not the same as the LOADI instructions
    // so no optimizations must be performed
    if (!(inst->p2 == inst1->p1 && inst->p3 == inst2->p2)) return false;
    
    // compute operands
    if (type == DOUBLE_TAG) {
        d1 = (inst1->tag == INT_TAG) ? (double)inst1->n : inst1->d;
        d2 = (inst2->tag == INT_TAG) ? (double)inst2->n : inst2->d;
    } else {
        n1 = (inst1->tag == INT_TAG) ? inst1->n : (int64_t)inst1->d;
        n2 = (inst2->tag == INT_TAG) ? inst2->n : (int64_t)inst2->d;
    }

    // perform operation
    switch (inst->op) {
        case ADD:
            if (type == DOUBLE_TAG) d = d1 + d2;
            else n = n1 + n2;
            break;

        case SUB:
            if (type == DOUBLE_TAG) d = d1 - d2;
            else n = n1 - n2;
            break;

        case MUL:
            if (type == DOUBLE_TAG) d = d1 * d2;
            else n = n1 * n2;
            break;

        case DIV:
            // don't optimize in case of division by 0
            if ((int64_t)d2 == 0) return false;
            if (type == DOUBLE_TAG) d = d1 / d2;
            else n = n1 / n2;
            break;

        case REM:
            if ((int64_t)d2 == 0) return false;
            if (type == DOUBLE_TAG) d = (double)((int64_t)d1 % (int64_t)d2);
            else n = n1 % n2;
            break;

        default:
            assert(0);
    }

    // adjust IRCODE
    inst_setskip(inst1);
    inst_setskip(inst2);

    // convert an ADD instruction to a LOADI instruction
    // ADD A B C    => R(A) = R(B) + R(C)
    // LOADI A B    => R(A) = N
    inst->op = LOADI;
    inst->tag = type;
    inst->p2 = inst->p3 = 0;
    if (type == DOUBLE_TAG) inst->d = d;
    else inst->n = n;

    return true;
}